

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_fa.c
# Opt level: O3

int isobusfs_srv_rx_cg_fa(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  ushort uVar4;
  wchar_t wVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  isobusfs_srv_client_conflict *client;
  size_t __nbytes;
  undefined8 *buf;
  dirent *pdVar9;
  size_t __n;
  tm *ptVar10;
  ulong uVar11;
  DIR *pDVar12;
  isobusfs_srv_client *piVar13;
  undefined8 uVar14;
  __off_t _Var15;
  int *piVar16;
  isobusfs_srv_handles *piVar17;
  size_t buf_size;
  undefined8 extraout_RDX;
  long lVar18;
  undefined1 uVar19;
  char *pcVar20;
  int iVar21;
  undefined1 *__buf;
  ssize_t sVar22;
  DIR *dir;
  char linux_path [4096];
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 *local_10d0;
  stat local_10c8;
  stat local_1038 [28];
  
  switch(msg->buf[0] & 0xf) {
  case 0:
    uVar3 = *(ushort *)(msg->buf + 4);
    client = (isobusfs_srv_client_conflict *)isobusfs_srv_get_client_by_msg(priv,msg);
    if (client == (isobusfs_srv_client_conflict *)0x0) {
      uVar19 = 0;
      isobusfs_log(2,"client not found");
      wVar5 = L',';
    }
    else {
      uVar19 = 0;
      wVar5 = L'\x02';
      if ((uVar3 < 0xfffb) && ((ulong)uVar3 <= msg->len - 6U)) {
        pcVar20 = (char *)malloc(0x1000);
        if (pcVar20 == (char *)0x0) {
          isobusfs_log(2,"failed to allocate memory");
          return -0xc;
        }
        if (client->current_dir[0] == '\0') {
          isobusfs_srv_set_default_current_dir((isobusfs_srv_priv_conflict *)priv,client);
        }
        wVar5 = isobusfs_convert_relative_to_absolute
                          ((isobusfs_srv_priv_conflict *)priv,client->current_dir,
                           (char *)(msg->buf + 6),(ulong)*(ushort *)(msg->buf + 4),pcVar20,0x1000);
        if (wVar5 < L'\0') {
          wVar5 = L'\x04';
LAB_00105a66:
          uVar19 = 0;
        }
        else {
          isobusfs_log(4,"< rx: Open File Request. from client 0x%2x: %.*s. Current directory: %s",
                       client->addr,*(undefined2 *)(msg->buf + 4),msg->buf + 6,client->current_dir);
          bVar1 = msg->buf[2];
          if ((~bVar1 & 3) == 0) {
            wVar5 = isobusfs_path_to_linux_path
                              ((isobusfs_srv_priv_conflict *)priv,pcVar20,0x1000,(char *)local_1038,
                               0x1000);
            if (wVar5 < L'\0') goto LAB_00105a66;
            lVar18 = 0xf3a48;
            do {
              pcVar20 = *(char **)((priv->st).reserved + lVar18 + -0x2f);
              if (pcVar20 != (char *)0x0) {
                iVar7 = strcmp(pcVar20,(char *)local_1038);
                if (iVar7 == 0) {
                  isobusfs_log(1,"%s: Path %s is already opened\n","isobusfs_srv_fa_open_directory",
                               local_1038);
                  goto LAB_00105a2e;
                }
              }
              lVar18 = lVar18 + 0x790;
            } while (lVar18 != 0x16c2b8);
            pDVar12 = opendir((char *)local_1038);
            if (pDVar12 == (DIR *)0x0) {
              piVar16 = __errno_location();
              iVar7 = *piVar16;
              pcVar20 = strerror(iVar7);
              uVar19 = 0;
              wVar5 = L'\x01';
              isobusfs_log(1,"%s: Error opening directory %s. Error %d (%s)\n",
                           "isobusfs_srv_fa_open_directory",local_1038,iVar7,pcVar20);
              iVar7 = *piVar16;
              if (iVar7 == 0xd) goto switchD_00105666_caseD_3;
              if (iVar7 != 0xc) {
                if (iVar7 == 2) goto LAB_00105a5a;
                goto LAB_00105a3d;
              }
LAB_00105a53:
              wVar5 = L'+';
              goto LAB_00105a66;
            }
            iVar7 = dirfd(pDVar12);
            if (iVar7 < 0) {
              piVar16 = __errno_location();
              iVar7 = *piVar16;
              pcVar20 = strerror(iVar7);
              isobusfs_log(1,"%s: Error getting file descriptor for directory %s. Error %d (%s)\n",
                           "isobusfs_srv_fa_open_directory",local_1038,iVar7,pcVar20);
              closedir(pDVar12);
LAB_00105a2e:
              uVar19 = 0;
              wVar5 = L',';
              goto switchD_00105666_caseD_3;
            }
            iVar21 = fstat(iVar7,&local_10c8);
            if ((iVar21 < 0) || ((local_10c8.st_mode & 0xf000) != 0x4000)) {
              uVar19 = 0;
              isobusfs_log(1,"%s: Path %s is not a directory\n","isobusfs_srv_fa_open_directory",
                           local_1038);
              closedir(pDVar12);
              wVar5 = L'\x02';
              goto switchD_00105666_caseD_3;
            }
            wVar5 = isobusfs_srv_request_file
                              (priv,(isobusfs_srv_client *)client,(char *)local_1038,iVar7,
                               (DIR *)pDVar12);
            if (wVar5 < L'\0') {
              closedir(pDVar12);
              goto LAB_00105a66;
            }
LAB_00105907:
            uVar19 = (undefined1)wVar5;
            wVar5 = L'\0';
          }
          else {
            wVar5 = isobusfs_path_to_linux_path
                              ((isobusfs_srv_priv_conflict *)priv,pcVar20,0x1000,(char *)local_1038,
                               0x1000);
            uVar6 = 0;
            uVar19 = 0;
            if (L'\xffffffff' < wVar5) {
              isobusfs_log(4,"convert ISOBUS FS path to linux path: %.*s -> %s",0x1000,pcVar20);
              wVar5 = L'\x02';
              switch(bVar1 & 3) {
              case 1:
                uVar6 = 1;
                break;
              case 2:
                uVar6 = (uint)((bVar1 & 8) == 0) << 9 | 2;
                break;
              case 3:
                goto switchD_00105666_caseD_3;
              }
              lVar18 = 0xf3a48;
              do {
                pcVar20 = *(char **)((priv->st).reserved + lVar18 + -0x2f);
                if (pcVar20 != (char *)0x0) {
                  iVar7 = strcmp(pcVar20,(char *)local_1038);
                  if (iVar7 == 0) {
                    isobusfs_log(2,"Handle: %s is already opened by client: %x\n",local_1038,
                                 client->addr);
                    iVar7 = *(int *)((long)(&priv->st + -4) + lVar18);
                    goto LAB_001058eb;
                  }
                }
                lVar18 = lVar18 + 0x790;
              } while (lVar18 != 0x16c2b8);
              iVar7 = open((char *)local_1038,(bVar1 & 8) << 7 | uVar6);
              if (iVar7 < 0) {
                piVar16 = __errno_location();
                iVar7 = *piVar16;
                if (iVar7 < 0x16) {
                  if (iVar7 == 2) {
LAB_00105a5a:
                    wVar5 = L'\x04';
                  }
                  else {
                    if (iVar7 == 0xc) goto LAB_00105a53;
                    if (iVar7 != 0xd) goto LAB_00105a3d;
                    wVar5 = L'\x01';
                  }
                }
                else if (iVar7 - 0x17U < 2) {
                  wVar5 = L'\x03';
                }
                else if (iVar7 != 0x16) goto LAB_00105a3d;
              }
              else {
                iVar21 = fstat(iVar7,&local_10c8);
                if (iVar21 < 0) {
                  close(iVar7);
LAB_00105a3d:
                  wVar5 = L',';
                }
                else {
                  if ((local_10c8.st_mode & 0xf000) == 0x8000) {
LAB_001058eb:
                    wVar5 = isobusfs_srv_request_file
                                      (priv,(isobusfs_srv_client *)client,(char *)local_1038,iVar7,
                                       (DIR *)0x0);
                    if (L'\xffffffff' < wVar5) goto LAB_00105907;
                  }
                  close(iVar7);
                }
              }
              goto LAB_00105a66;
            }
          }
        }
      }
    }
switchD_00105666_caseD_3:
    local_10e0._0_4_ = CONCAT13(uVar19,CONCAT12((char)wVar5,CONCAT11(msg->buf[1],0x20)));
    local_10e0 = CONCAT17(0xff,CONCAT25(0xffff,(undefined5)local_10e0));
    iVar7 = isobusfs_srv_sendto(priv,msg,&local_10e0,8);
    if (-1 < iVar7) {
      uVar14 = isobusfs_error_to_str(wVar5 & 0xffU);
      isobusfs_log(4,"> tx: Open File Response. Error code: %d (%s).",wVar5 & 0xffU,uVar14);
      return iVar7;
    }
    break;
  case 1:
    local_1038[0].st_dev._0_1_ = 0x21;
    local_1038[0].st_dev._1_1_ = 0;
    local_1038[0].st_dev._2_1_ = 0;
    local_1038[0].st_dev._3_4_ = 0;
    local_1038[0].st_dev._7_1_ = 0;
    isobusfs_log(4,"< rx: Seek File Request. Handle: %x, offset: %d, position mode: %d",msg->buf[2],
                 *(undefined4 *)(msg->buf + 4),msg->buf[3]);
    piVar13 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar13 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      uVar19 = 0x2c;
    }
    else {
      uVar11 = (ulong)msg->buf[2];
      if (uVar11 == 0xff) {
        isobusfs_log(2,"failed to find handle: %x",0xff);
        uVar19 = 5;
      }
      else {
        iVar7 = *(int *)(msg->buf + 4);
        if (priv->handles[uVar11].dir == (DIR *)0x0) {
          uVar2 = msg->buf[3];
          if (uVar2 == '\x02') {
            if (0 < iVar7) {
              pcVar20 = "Invalid offset. Offset must be negative";
              goto LAB_001056b2;
            }
            iVar21 = 2;
LAB_00105793:
            _Var15 = lseek(priv->handles[uVar11].fd,(long)iVar7,iVar21);
            if (_Var15 < 0) {
              pcVar20 = "Failed to seek file";
LAB_001057b3:
              isobusfs_log(2,pcVar20);
              uVar19 = 0x2c;
            }
            else {
              priv->handles[uVar11].offset = _Var15;
              uVar19 = 0;
            }
          }
          else {
            if (uVar2 == '\x01') {
              iVar21 = 1;
              if ((-1 < iVar7) || ((long)(ulong)(uint)-iVar7 <= priv->handles[uVar11].offset))
              goto LAB_00105793;
              pcVar20 = "Invalid offset. Negative offset is too big.";
            }
            else {
              if (uVar2 != '\0') {
                pcVar20 = "invalid position mode";
                goto LAB_001057b3;
              }
              iVar21 = 0;
              if (-1 < iVar7) goto LAB_00105793;
              pcVar20 = "Invalid offset. Offset must be positive.";
            }
LAB_001056b2:
            isobusfs_log(2,pcVar20);
            uVar19 = 0x2a;
          }
          iVar8 = (int32_t)priv->handles[uVar11].offset;
        }
        else {
          pDVar12 = fdopendir(priv->handles[uVar11].fd);
          if (pDVar12 == (DIR *)0x0) {
            uVar19 = 0x2c;
          }
          else {
            rewinddir(pDVar12);
            iVar21 = iVar7;
            if (0 < iVar7) {
              do {
                pdVar9 = readdir(pDVar12);
                if (pdVar9 == (dirent *)0x0) {
                  uVar19 = 0x2d;
                  goto LAB_00105676;
                }
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            priv->handles[uVar11].dir_pos = iVar7;
            uVar19 = 0;
          }
LAB_00105676:
          iVar8 = priv->handles[uVar11].dir_pos;
        }
        local_1038[0].st_dev._4_3_ = (undefined3)iVar8;
        local_1038[0].st_dev._7_1_ = (undefined1)((uint)iVar8 >> 0x18);
      }
    }
    local_1038[0].st_dev._1_1_ = msg->buf[1];
    local_1038[0].st_dev._2_1_ = uVar19;
    iVar7 = isobusfs_srv_sendto(priv,msg,local_1038,8);
    if (-1 < iVar7) {
      isobusfs_log(4,"> tx: Seek File Response. Error code: %d, offset: %d",uVar19,0);
      return 0;
    }
    pcVar20 = "can\'t send seek file response";
    goto LAB_00105ace;
  case 2:
    local_10e0 = 0xffffffffffffff;
    uVar3 = *(ushort *)(msg->buf + 4);
    isobusfs_log(4,"< rx: Read File Request. tan: %d, handle: %d, count: %d",msg->buf[1],msg->buf[2]
                 ,uVar3);
    __nbytes = 0xfffa;
    if (uVar3 < 0xfffa) {
      __nbytes = (ulong)uVar3;
    }
    buf = (undefined8 *)malloc(__nbytes + 6);
    if (buf == (undefined8 *)0x0) {
      sVar22 = 0;
      isobusfs_log(2,"failed to allocate memory");
      buf = &local_10e0;
      uVar19 = 0x2b;
    }
    else {
      piVar13 = isobusfs_srv_get_client_by_msg(priv,msg);
      if (piVar13 == (isobusfs_srv_client *)0x0) {
        sVar22 = 0;
        isobusfs_log(2,"client not found");
        uVar19 = 0x2c;
      }
      else {
        local_10d8 = 0;
        piVar17 = priv->handles + msg->buf[2];
        if ((ulong)msg->buf[2] == 0xff) {
          isobusfs_log(2,"failed to find file with handle: %x",0xff);
          local_10d8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),4);
          piVar17 = (isobusfs_srv_handles *)0x0;
        }
        pDVar12 = (DIR *)piVar17->dir;
        __buf = (undefined1 *)((long)buf + 6);
        local_10d0 = buf;
        if (pDVar12 == (DIR *)0x0) {
          sVar22 = read(piVar17->fd,__buf,__nbytes);
        }
        else {
          if (0 < piVar17->dir_pos) {
            iVar7 = 0;
            do {
              pdVar9 = readdir(pDVar12);
              if (pdVar9 == (dirent *)0x0) break;
              iVar7 = iVar7 + 1;
            } while (iVar7 < piVar17->dir_pos);
          }
          pdVar9 = readdir(pDVar12);
          if (pdVar9 == (dirent *)0x0) {
            sVar22 = 0;
          }
          else {
            sVar22 = 0;
            do {
              pcVar20 = pdVar9->d_name;
              iVar7 = check_access_with_base(piVar17->path,pcVar20,4);
              if (((iVar7 == 0) && (iVar7 = fstatat(piVar17->fd,pcVar20,local_1038,0), -1 < iVar7))
                 && (__n = strlen(pcVar20), __n < 0x100)) {
                if (__nbytes < __n + sVar22 + 10) break;
                __buf[sVar22] = (char)__n;
                memcpy(__buf + sVar22 + 1,pcVar20,__n);
                lVar18 = sVar22 + __n;
                uVar6 = local_1038[0].st_mode & 0xf000;
                iVar7 = check_access_with_base(piVar17->path,pcVar20,2);
                __buf[lVar18 + 1] = iVar7 != 0 | (uVar6 == 0x4000) << 4;
                local_10c8.st_dev = local_1038[0].st_mtim.tv_sec;
                ptVar10 = localtime((time_t *)&local_10c8);
                if ((ptVar10 == (tm *)0x0) || (ptVar10->tm_year - 0xd0U < 0xffffff80)) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = (short)ptVar10->tm_year * 0x200 + 0x6000U | (ushort)ptVar10->tm_mday |
                          (short)ptVar10->tm_mon * 0x20 + 0x20U;
                }
                *(ushort *)((long)buf + lVar18 + 8) = uVar4;
                local_10c8.st_dev = local_1038[0].st_mtim.tv_sec;
                ptVar10 = localtime((time_t *)&local_10c8);
                if (ptVar10 == (tm *)0x0) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = (ushort)(ptVar10->tm_min << 5) | (ushort)(ptVar10->tm_hour << 0xb) |
                          (ushort)((uint)(ptVar10->tm_sec - (ptVar10->tm_sec >> 0x1f)) >> 1);
                }
                *(ushort *)((long)buf + lVar18 + 10) = uVar4;
                *(undefined4 *)((long)buf + lVar18 + 0xc) = (undefined4)local_1038[0].st_size;
                sVar22 = lVar18 + 10;
              }
              pdVar9 = readdir(pDVar12);
            } while (pdVar9 != (dirent *)0x0);
          }
        }
        uVar19 = 0x2d;
        if (sVar22 != 0) {
          uVar19 = (undefined1)local_10d8;
        }
        buf = local_10d0;
        if (uVar3 == 0) {
          uVar19 = (undefined1)local_10d8;
        }
      }
    }
    *(undefined1 *)buf = 0x22;
    *(uint8_t *)((long)buf + 1) = msg->buf[1];
    *(undefined1 *)((long)buf + 2) = uVar19;
    *(short *)((long)buf + 4) = (short)sVar22;
    buf_size = 8;
    if (8 < (long)(sVar22 + 6U)) {
      buf_size = sVar22 + 6U;
    }
    iVar7 = isobusfs_srv_sendto(priv,msg,buf,buf_size);
    if (iVar7 < 0) {
      isobusfs_log(2,"can\'t send Read File Response");
    }
    else {
      uVar14 = isobusfs_error_to_str(uVar19);
      isobusfs_log(4,"> tx: Read File Response. Error code: %d (%s), readed size: %d",uVar19,uVar14,
                   sVar22);
    }
    free(buf);
    return iVar7;
  default:
    isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_fa");
    isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
    return 0;
  case 4:
    piVar13 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar13 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      uVar19 = 0x2c;
    }
    else {
      uVar11 = (ulong)msg->buf[2];
      if (uVar11 == 0xff) {
        isobusfs_log(2,"%s: invalid handle %d","isobusfs_srv_release_handle",0xff);
      }
      else {
        lVar18 = 0;
        do {
          if (priv->handles[uVar11].clients[lVar18] == piVar13) {
            priv->handles[uVar11].clients[lVar18] = (isobusfs_srv_client *)0x0;
            piVar16 = &priv->handles[uVar11].refcount;
            *piVar16 = *piVar16 + -1;
            uVar19 = 0;
            isobusfs_log(4,"%s: client %p removed from handle %d","isobusfs_srv_release_handle",
                         piVar13,uVar11);
            if (priv->handles[uVar11].refcount == 0) {
              isobusfs_log(4,"%s: closing handle %d","isobusfs_srv_release_handle",uVar11);
              pDVar12 = (DIR *)priv->handles[uVar11].dir;
              if (pDVar12 == (DIR *)0x0) {
                close(priv->handles[uVar11].fd);
              }
              else {
                closedir(pDVar12);
              }
              uVar19 = 0;
              memset(priv->handles + uVar11,0,0x790);
              priv->handles_count = priv->handles_count + -1;
            }
            goto LAB_001056f3;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0xed);
        isobusfs_log(1,"%s: client %p not found in handle %d","isobusfs_srv_release_handle",piVar13,
                     uVar11);
      }
      isobusfs_log(2,"failed to release handle: %x",msg->buf[2]);
      uVar19 = 4;
    }
LAB_001056f3:
    local_1038[0].st_dev._0_1_ = 0x24;
    local_1038[0].st_dev._1_1_ = msg->buf[1];
    local_1038[0].st_dev._3_4_ = 0xffffffff;
    local_1038[0].st_dev._7_1_ = 0xff;
    local_1038[0].st_ino._0_1_ = 0xff;
    local_1038[0].st_dev._2_1_ = uVar19;
    iVar7 = isobusfs_srv_sendto(priv,msg,local_1038,9);
    if (-1 < iVar7) {
      isobusfs_log(4,"> tx: Close File Response. Error code: %d",uVar19);
      return iVar7;
    }
  }
  pcVar20 = "can\'t send current directory response";
LAB_00105ace:
  isobusfs_log(2,pcVar20);
  return iVar7;
}

Assistant:

int isobusfs_srv_rx_cg_fa(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	int func = isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	switch (func) {
	case ISOBUSFS_FA_F_OPEN_FILE_REQ:
		ret = isobusfs_srv_fa_open_file_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_CLOSE_FILE_REQ:
		ret = isobusfs_srv_fa_cf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_READ_FILE_REQ:
		ret = isobusfs_srv_fa_rf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_SEEK_FILE_REQ:
		ret = isobusfs_srv_fa_sf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_WRITE_FILE_REQ: /* fall through */
	default:
		pr_warn("%s: unsupported function: %i", __func__, func);
		isobusfs_srv_send_error(priv, msg,
					ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
	}

	return ret;
}